

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPController.cpp
# Opt level: O3

int __thiscall TCPController::close(TCPController *this,int __fd)

{
  TCPConnection *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  iterator iVar1;
  mapped_type *pmVar2;
  int iVar3;
  int local_1c;
  key_type *__k;
  
  local_1c = __fd;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  iVar1 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->connections)._M_h,&local_1c);
  if (iVar1.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
    iVar3 = -1;
  }
  else {
    __k = &local_1c;
    pmVar2 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->connections,__k);
    iVar3 = (int)__k;
    this_00 = (pmVar2->super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_01 = (pmVar2->super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
    TCPConnection::close(this_00,iVar3);
    iVar3 = 0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int TCPController::close(int fd) {
    std::shared_lock lock(mutex_);
    if (connections.find(fd) != connections.end()) {
        auto conn = connections[fd];
        lock.unlock();
        conn->close();
        return 0;
    }
    return -1;
}